

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O0

uint32_t *
createDFDUnpacked(int bigEndian,int numChannels,int bytes,int redBlueSwap,VkSuffix suffix)

{
  uint32_t *puVar1;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int unaff_retaddr;
  VkSuffix in_stack_00000008;
  int channel_1;
  int sampleCounter;
  int channel;
  int channelByte;
  int channelCounter;
  uint32_t *DFD;
  channels_infotype in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  int in_stack_ffffffffffffffdc;
  int iVar2;
  int in_stack_ffffffffffffffe8;
  
  if (in_EDI == 0) {
    puVar1 = writeHeader(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      writeSample((uint32_t *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffe8,
                  (int)((ulong)puVar1 >> 0x20),(int)puVar1,in_stack_ffffffffffffffdc,unaff_retaddr,
                  in_stack_00000008);
    }
  }
  else {
    puVar1 = writeHeader(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
        writeSample((uint32_t *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffe8,
                    (int)((ulong)puVar1 >> 0x20),(int)puVar1,iVar2,unaff_retaddr,in_stack_00000008);
      }
    }
  }
  return puVar1;
}

Assistant:

uint32_t *createDFDUnpacked(int bigEndian, int numChannels, int bytes,
                            int redBlueSwap, enum VkSuffix suffix)
{
    uint32_t *DFD;
    if (bigEndian) {
        int channelCounter, channelByte;
        /* Number of samples = number of channels * bytes per channel */
        DFD = writeHeader(numChannels * bytes, numChannels * bytes, suffix, i_COLOR);
        /* First loop over the channels */
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            int channel = channelCounter;
            if (redBlueSwap && (channel == 0 || channel == 2)) {
                channel ^= 2;
            }
            /* Loop over the bytes that constitute a channel */
            for (channelByte = 0; channelByte < bytes; ++channelByte) {
                writeSample(DFD, channelCounter * bytes + channelByte, channel,
                            8, 8 * (channelCounter * bytes + bytes - channelByte - 1),
                            channelByte == bytes-1, channelByte == 0, suffix);
            }
        }

    } else { /* Little-endian */

        int sampleCounter;
        /* One sample per channel */
        DFD = writeHeader(numChannels, numChannels * bytes, suffix, i_COLOR);
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            int channel = sampleCounter;
            if (redBlueSwap && (channel == 0 || channel == 2)) {
                channel ^= 2;
            }
            writeSample(DFD, sampleCounter, channel,
                        8 * bytes, 8 * sampleCounter * bytes,
                        1, 1, suffix);
        }
    }
    return DFD;
}